

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

uint8_t * __thiscall
CoreML::Specification::LinearQuantizationParams::_InternalSerialize
          (LinearQuantizationParams *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  void *pvVar1;
  bool bVar2;
  LogMessage *pLVar3;
  ulong uVar4;
  byte *pbVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  size_t sVar10;
  byte *pbVar11;
  LogFinisher local_61;
  LogMessage local_60;
  
  iVar8 = (this->scale_).current_size_;
  if (0 < iVar8) {
    pbVar5 = stream->end_;
    if (pbVar5 <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      iVar8 = (this->scale_).current_size_;
      pbVar5 = stream->end_;
    }
    if (pbVar5 <= target) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x36d);
      pLVar3 = google::protobuf::internal::LogMessage::operator<<
                         (&local_60,"CHECK failed: ptr < end_: ");
      google::protobuf::internal::LogFinisher::operator=(&local_61,pLVar3);
      google::protobuf::internal::LogMessage::~LogMessage(&local_60);
    }
    uVar9 = iVar8 << 2;
    *target = 10;
    pbVar5 = target + 1;
    uVar7 = uVar9;
    uVar6 = uVar9;
    if (0x7f < uVar9) {
      do {
        target = pbVar5;
        *target = (byte)uVar6 | 0x80;
        uVar7 = uVar6 >> 7;
        pbVar5 = target + 1;
        bVar2 = 0x3fff < uVar6;
        uVar6 = uVar7;
      } while (bVar2);
    }
    pbVar11 = target + 2;
    *pbVar5 = (byte)uVar7;
    pvVar1 = (this->scale_).arena_or_elements_;
    sVar10 = (size_t)(int)uVar9;
    if ((long)stream->end_ - (long)pbVar11 < (long)sVar10) {
      target = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                         (stream,pvVar1,uVar9,pbVar11);
    }
    else {
      memcpy(pbVar11,pvVar1,sVar10);
      target = pbVar11 + sVar10;
    }
  }
  iVar8 = (this->bias_).current_size_;
  if (0 < iVar8) {
    pbVar5 = stream->end_;
    if (pbVar5 <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      iVar8 = (this->bias_).current_size_;
      pbVar5 = stream->end_;
    }
    if (pbVar5 <= target) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x36d);
      pLVar3 = google::protobuf::internal::LogMessage::operator<<
                         (&local_60,"CHECK failed: ptr < end_: ");
      google::protobuf::internal::LogFinisher::operator=(&local_61,pLVar3);
      google::protobuf::internal::LogMessage::~LogMessage(&local_60);
    }
    uVar9 = iVar8 << 2;
    *target = 0x12;
    pbVar5 = target + 1;
    uVar7 = uVar9;
    uVar6 = uVar9;
    if (0x7f < uVar9) {
      do {
        target = pbVar5;
        *target = (byte)uVar6 | 0x80;
        uVar7 = uVar6 >> 7;
        pbVar5 = target + 1;
        bVar2 = 0x3fff < uVar6;
        uVar6 = uVar7;
      } while (bVar2);
    }
    pbVar11 = target + 2;
    *pbVar5 = (byte)uVar7;
    pvVar1 = (this->bias_).arena_or_elements_;
    sVar10 = (size_t)(int)uVar9;
    if ((long)stream->end_ - (long)pbVar11 < (long)sVar10) {
      target = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                         (stream,pvVar1,uVar9,pbVar11);
    }
    else {
      memcpy(pbVar11,pvVar1,sVar10);
      target = pbVar11 + sVar10;
    }
  }
  uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar4 & 1) != 0) {
    uVar4 = uVar4 & 0xfffffffffffffffc;
    pvVar1 = *(void **)(uVar4 + 8);
    iVar8 = (int)*(undefined8 *)(uVar4 + 0x10);
    sVar10 = (size_t)iVar8;
    if ((long)stream->end_ - (long)target < (long)sVar10) {
      target = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                         (stream,pvVar1,iVar8,target);
    }
    else {
      memcpy(target,pvVar1,sVar10);
      target = target + sVar10;
    }
  }
  return target;
}

Assistant:

uint8_t* LinearQuantizationParams::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.LinearQuantizationParams)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated float scale = 1;
  if (this->_internal_scale_size() > 0) {
    target = stream->WriteFixedPacked(1, _internal_scale(), target);
  }

  // repeated float bias = 2;
  if (this->_internal_bias_size() > 0) {
    target = stream->WriteFixedPacked(2, _internal_bias(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.LinearQuantizationParams)
  return target;
}